

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O0

Gia_Man_t * Unr_ManUnroll(Gia_Man_t *pGia,int nFrames)

{
  Unr_Man_t *p_00;
  Gia_Man_t *pGVar1;
  int local_2c;
  int f;
  Gia_Man_t *pFrames;
  Unr_Man_t *p;
  int nFrames_local;
  Gia_Man_t *pGia_local;
  
  p_00 = Unr_ManUnrollStart(pGia,1);
  for (local_2c = 0; local_2c < nFrames; local_2c = local_2c + 1) {
    Unr_ManUnrollFrame(p_00,local_2c);
  }
  pGVar1 = Gia_ManCleanup(p_00->pFrames);
  Unr_ManFree(p_00);
  return pGVar1;
}

Assistant:

Gia_Man_t * Unr_ManUnroll( Gia_Man_t * pGia, int nFrames )
{
    Unr_Man_t * p;
    Gia_Man_t * pFrames;
    int f;
    p = Unr_ManUnrollStart( pGia, 1 );
    for ( f = 0; f < nFrames; f++ )
        Unr_ManUnrollFrame( p, f );
    pFrames = Gia_ManCleanup( p->pFrames );
    Unr_ManFree( p );
    return pFrames;
}